

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  undefined4 uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  long lVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong unaff_R13;
  undefined1 (*pauVar27) [16];
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar47 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar49 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  vfloat<8> tNear;
  vint8 bi;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  uint local_2480;
  uint uStack_247c;
  uint uStack_2478;
  uint uStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  float local_2460;
  float fStack_245c;
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  float fStack_2444;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined4 local_2420;
  undefined4 uStack_241c;
  undefined4 uStack_2418;
  undefined4 uStack_2414;
  undefined4 uStack_2410;
  undefined4 uStack_240c;
  undefined4 uStack_2408;
  undefined4 uStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar46 [64];
  undefined1 auVar48 [64];
  undefined1 auVar50 [64];
  
  pauVar27 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  local_23c0 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_23e0 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2400 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2420 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_241c = local_2420;
  uStack_2418 = local_2420;
  uStack_2414 = local_2420;
  uStack_2410 = local_2420;
  uStack_240c = local_2420;
  uStack_2408 = local_2420;
  uStack_2404 = local_2420;
  local_2440 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_243c = local_2440;
  uStack_2438 = local_2440;
  uStack_2434 = local_2440;
  uStack_2430 = local_2440;
  uStack_242c = local_2440;
  uStack_2428 = local_2440;
  uStack_2424 = local_2440;
  local_2460 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_245c = local_2460;
  fStack_2458 = local_2460;
  fStack_2454 = local_2460;
  fStack_2450 = local_2460;
  fStack_244c = local_2460;
  fStack_2448 = local_2460;
  fStack_2444 = local_2460;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_24a0._4_4_ = fVar1;
  local_24a0._0_4_ = fVar1;
  local_24a0._8_4_ = fVar1;
  local_24a0._12_4_ = fVar1;
  local_24a0._16_4_ = fVar1;
  local_24a0._20_4_ = fVar1;
  local_24a0._24_4_ = fVar1;
  local_24a0._28_4_ = fVar1;
  auVar42 = ZEXT3264(local_24a0);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_24c0._4_4_ = fVar2;
  local_24c0._0_4_ = fVar2;
  local_24c0._8_4_ = fVar2;
  local_24c0._12_4_ = fVar2;
  local_24c0._16_4_ = fVar2;
  local_24c0._20_4_ = fVar2;
  local_24c0._24_4_ = fVar2;
  local_24c0._28_4_ = fVar2;
  auVar43 = ZEXT3264(local_24c0);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_24e0._4_4_ = fVar3;
  local_24e0._0_4_ = fVar3;
  local_24e0._8_4_ = fVar3;
  local_24e0._12_4_ = fVar3;
  local_24e0._16_4_ = fVar3;
  local_24e0._20_4_ = fVar3;
  local_24e0._24_4_ = fVar3;
  local_24e0._28_4_ = fVar3;
  auVar44 = ZEXT3264(local_24e0);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar17 = (tray->tnear).field_0.i[k];
  local_2560._4_4_ = iVar17;
  local_2560._0_4_ = iVar17;
  local_2560._8_4_ = iVar17;
  local_2560._12_4_ = iVar17;
  local_2560._16_4_ = iVar17;
  local_2560._20_4_ = iVar17;
  local_2560._24_4_ = iVar17;
  local_2560._28_4_ = iVar17;
  auVar45 = ZEXT3264(local_2560);
  iVar17 = (tray->tfar).field_0.i[k];
  auVar30 = ZEXT3264(CONCAT428(iVar17,CONCAT424(iVar17,CONCAT420(iVar17,CONCAT416(iVar17,CONCAT412(
                                                  iVar17,CONCAT48(iVar17,CONCAT44(iVar17,iVar17)))))
                                               )));
  fStack_23bc = local_23c0;
  fStack_23b8 = local_23c0;
  fStack_23b4 = local_23c0;
  fStack_23b0 = local_23c0;
  fStack_23ac = local_23c0;
  fStack_23a8 = local_23c0;
  fStack_23a4 = local_23c0;
  auVar47._0_4_ = fVar1 * -local_23c0;
  auVar47._4_4_ = fVar1 * -local_23c0;
  auVar47._8_4_ = fVar1 * -local_23c0;
  auVar47._12_4_ = fVar1 * -local_23c0;
  auVar47._16_4_ = fVar1 * -local_23c0;
  auVar47._20_4_ = fVar1 * -local_23c0;
  auVar47._28_36_ = in_ZMM10._28_36_;
  auVar47._24_4_ = fVar1 * -local_23c0;
  auVar46 = ZEXT3264(auVar47._0_32_);
  fStack_23dc = local_23e0;
  fStack_23d8 = local_23e0;
  fStack_23d4 = local_23e0;
  fStack_23d0 = local_23e0;
  fStack_23cc = local_23e0;
  fStack_23c8 = local_23e0;
  fStack_23c4 = local_23e0;
  auVar49._0_4_ = fVar2 * -local_23e0;
  auVar49._4_4_ = fVar2 * -local_23e0;
  auVar49._8_4_ = fVar2 * -local_23e0;
  auVar49._12_4_ = fVar2 * -local_23e0;
  auVar49._16_4_ = fVar2 * -local_23e0;
  auVar49._20_4_ = fVar2 * -local_23e0;
  auVar49._28_36_ = in_ZMM11._28_36_;
  auVar49._24_4_ = fVar2 * -local_23e0;
  auVar48 = ZEXT3264(auVar49._0_32_);
  fStack_23fc = local_2400;
  fStack_23f8 = local_2400;
  fStack_23f4 = local_2400;
  fStack_23f0 = local_2400;
  fStack_23ec = local_2400;
  fStack_23e8 = local_2400;
  fStack_23e4 = local_2400;
  local_2480 = 0x80000000;
  uStack_247c = 0x80000000;
  uStack_2478 = 0x80000000;
  uStack_2474 = 0x80000000;
  fStack_2470 = -0.0;
  fStack_246c = -0.0;
  fStack_2468 = -0.0;
  uStack_2464 = 0x80000000;
  auVar51._0_4_ = fVar3 * -local_2400;
  auVar51._4_4_ = fVar3 * -local_2400;
  auVar51._8_4_ = fVar3 * -local_2400;
  auVar51._12_4_ = fVar3 * -local_2400;
  auVar51._16_4_ = fVar3 * -local_2400;
  auVar51._20_4_ = fVar3 * -local_2400;
  auVar51._28_36_ = in_ZMM12._28_36_;
  auVar51._24_4_ = fVar3 * -local_2400;
  auVar50 = ZEXT3264(auVar51._0_32_);
  local_2500 = auVar47._0_32_;
  local_2520 = auVar49._0_32_;
  local_2540 = auVar51._0_32_;
  do {
    do {
      if (pauVar27 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar28 = pauVar27 + -1;
      pauVar27 = pauVar27 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar28 + 8));
    uVar25 = *(ulong *)*pauVar27;
    do {
      if ((uVar25 & 0xf) == 0) {
        auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar29),auVar46._0_32_,
                                  auVar42._0_32_);
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar19),auVar48._0_32_,
                                  auVar43._0_32_);
        auVar10 = vpmaxsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar34));
        auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar26),auVar50._0_32_,
                                  auVar44._0_32_);
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar29 ^ 0x20)),
                                  auVar46._0_32_,auVar42._0_32_);
        auVar36 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar19 ^ 0x20)),
                                  auVar48._0_32_,auVar43._0_32_);
        auVar33 = vpminsd_avx2(ZEXT1632(auVar34),ZEXT1632(auVar36));
        auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar26 ^ 0x20)),
                                  auVar50._0_32_,auVar44._0_32_);
        auVar11 = vpmaxsd_avx2(ZEXT1632(auVar31),auVar45._0_32_);
        local_2580 = vpmaxsd_avx2(auVar10,auVar11);
        auVar10 = vpminsd_avx2(ZEXT1632(auVar34),auVar30._0_32_);
        auVar10 = vpminsd_avx2(auVar33,auVar10);
        auVar10 = vpcmpgtd_avx2(local_2580,auVar10);
        uVar16 = vmovmskps_avx(auVar10);
        unaff_R13 = (ulong)(byte)~(byte)uVar16;
LAB_00672014:
        bVar15 = true;
      }
      else {
        if ((int)(uVar25 & 0xf) == 2) {
          uVar24 = uVar25 & 0xfffffffffffffff0;
          auVar10 = *(undefined1 (*) [32])(uVar24 + 0x100);
          auVar42._0_4_ = local_2460 * auVar10._0_4_;
          auVar42._4_4_ = fStack_245c * auVar10._4_4_;
          auVar42._8_4_ = fStack_2458 * auVar10._8_4_;
          auVar42._12_4_ = fStack_2454 * auVar10._12_4_;
          auVar42._16_4_ = fStack_2450 * auVar10._16_4_;
          auVar42._20_4_ = fStack_244c * auVar10._20_4_;
          auVar42._28_36_ = auVar43._28_36_;
          auVar42._24_4_ = fStack_2448 * auVar10._24_4_;
          auVar11 = *(undefined1 (*) [32])(uVar24 + 0x120);
          auVar43._0_4_ = local_2460 * auVar11._0_4_;
          auVar43._4_4_ = fStack_245c * auVar11._4_4_;
          auVar43._8_4_ = fStack_2458 * auVar11._8_4_;
          auVar43._12_4_ = fStack_2454 * auVar11._12_4_;
          auVar43._16_4_ = fStack_2450 * auVar11._16_4_;
          auVar43._20_4_ = fStack_244c * auVar11._20_4_;
          auVar43._28_36_ = auVar48._28_36_;
          auVar43._24_4_ = fStack_2448 * auVar11._24_4_;
          auVar33 = *(undefined1 (*) [32])(uVar24 + 0x140);
          auVar44._0_4_ = local_2460 * auVar33._0_4_;
          auVar44._4_4_ = fStack_245c * auVar33._4_4_;
          auVar44._8_4_ = fStack_2458 * auVar33._8_4_;
          auVar44._12_4_ = fStack_2454 * auVar33._12_4_;
          auVar44._16_4_ = fStack_2450 * auVar33._16_4_;
          auVar44._20_4_ = fStack_244c * auVar33._20_4_;
          auVar44._28_36_ = auVar50._28_36_;
          auVar44._24_4_ = fStack_2448 * auVar33._24_4_;
          auVar6._4_4_ = uStack_243c;
          auVar6._0_4_ = local_2440;
          auVar6._8_4_ = uStack_2438;
          auVar6._12_4_ = uStack_2434;
          auVar6._16_4_ = uStack_2430;
          auVar6._20_4_ = uStack_242c;
          auVar6._24_4_ = uStack_2428;
          auVar6._28_4_ = uStack_2424;
          auVar31 = vfmadd231ps_fma(auVar42._0_32_,auVar6,*(undefined1 (*) [32])(uVar24 + 0xa0));
          auVar34 = vfmadd231ps_fma(auVar43._0_32_,auVar6,*(undefined1 (*) [32])(uVar24 + 0xc0));
          auVar36 = vfmadd231ps_fma(auVar44._0_32_,auVar6,*(undefined1 (*) [32])(uVar24 + 0xe0));
          auVar7._4_4_ = uStack_241c;
          auVar7._0_4_ = local_2420;
          auVar7._8_4_ = uStack_2418;
          auVar7._12_4_ = uStack_2414;
          auVar7._16_4_ = uStack_2410;
          auVar7._20_4_ = uStack_240c;
          auVar7._24_4_ = uStack_2408;
          auVar7._28_4_ = uStack_2404;
          auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar7,*(undefined1 (*) [32])(uVar24 + 0x40));
          auVar34 = vfmadd231ps_fma(ZEXT1632(auVar34),auVar7,*(undefined1 (*) [32])(uVar24 + 0x60));
          auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar7,*(undefined1 (*) [32])(uVar24 + 0x80));
          auVar52._8_4_ = 0x7fffffff;
          auVar52._0_8_ = 0x7fffffff7fffffff;
          auVar52._12_4_ = 0x7fffffff;
          auVar52._16_4_ = 0x7fffffff;
          auVar52._20_4_ = 0x7fffffff;
          auVar52._24_4_ = 0x7fffffff;
          auVar52._28_4_ = 0x7fffffff;
          auVar6 = vandps_avx(auVar52,ZEXT1632(auVar31));
          auVar53._8_4_ = 0x219392ef;
          auVar53._0_8_ = 0x219392ef219392ef;
          auVar53._12_4_ = 0x219392ef;
          auVar53._16_4_ = 0x219392ef;
          auVar53._20_4_ = 0x219392ef;
          auVar53._24_4_ = 0x219392ef;
          auVar53._28_4_ = 0x219392ef;
          auVar6 = vcmpps_avx(auVar6,auVar53,1);
          auVar7 = vblendvps_avx(ZEXT1632(auVar31),auVar53,auVar6);
          auVar6 = vandps_avx(ZEXT1632(auVar34),auVar52);
          auVar6 = vcmpps_avx(auVar6,auVar53,1);
          auVar35 = vblendvps_avx(ZEXT1632(auVar34),auVar53,auVar6);
          auVar6 = vandps_avx(ZEXT1632(auVar36),auVar52);
          auVar6 = vcmpps_avx(auVar6,auVar53,1);
          auVar6 = vblendvps_avx(ZEXT1632(auVar36),auVar53,auVar6);
          auVar9 = vrcpps_avx(auVar7);
          auVar54._8_4_ = 0x3f800000;
          auVar54._0_8_ = &DAT_3f8000003f800000;
          auVar54._12_4_ = 0x3f800000;
          auVar54._16_4_ = 0x3f800000;
          auVar54._20_4_ = 0x3f800000;
          auVar54._24_4_ = 0x3f800000;
          auVar54._28_4_ = 0x3f800000;
          auVar31 = vfnmadd213ps_fma(auVar7,auVar9,auVar54);
          auVar31 = vfmadd132ps_fma(ZEXT1632(auVar31),auVar9,auVar9);
          auVar7 = vrcpps_avx(auVar35);
          auVar34 = vfnmadd213ps_fma(auVar35,auVar7,auVar54);
          auVar35 = vrcpps_avx(auVar6);
          auVar34 = vfmadd132ps_fma(ZEXT1632(auVar34),auVar7,auVar7);
          auVar36 = vfnmadd213ps_fma(auVar6,auVar35,auVar54);
          auVar9._4_4_ = fStack_23fc;
          auVar9._0_4_ = local_2400;
          auVar9._8_4_ = fStack_23f8;
          auVar9._12_4_ = fStack_23f4;
          auVar9._16_4_ = fStack_23f0;
          auVar9._20_4_ = fStack_23ec;
          auVar9._24_4_ = fStack_23e8;
          auVar9._28_4_ = fStack_23e4;
          auVar32 = vfmadd213ps_fma(auVar10,auVar9,*(undefined1 (*) [32])(uVar24 + 0x160));
          auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar35,auVar35);
          auVar10._4_4_ = fStack_23dc;
          auVar10._0_4_ = local_23e0;
          auVar10._8_4_ = fStack_23d8;
          auVar10._12_4_ = fStack_23d4;
          auVar10._16_4_ = fStack_23d0;
          auVar10._20_4_ = fStack_23cc;
          auVar10._24_4_ = fStack_23c8;
          auVar10._28_4_ = fStack_23c4;
          auVar39 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar10,*(undefined1 (*) [32])(uVar24 + 0xa0))
          ;
          auVar32 = vfmadd213ps_fma(auVar11,auVar9,*(undefined1 (*) [32])(uVar24 + 0x180));
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar10,*(undefined1 (*) [32])(uVar24 + 0xc0));
          auVar45 = ZEXT3264(local_2560);
          auVar32 = vfmadd213ps_fma(auVar33,auVar9,*(undefined1 (*) [32])(uVar24 + 0x1a0));
          auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar10,*(undefined1 (*) [32])(uVar24 + 0xe0))
          ;
          auVar11._4_4_ = fStack_23bc;
          auVar11._0_4_ = local_23c0;
          auVar11._8_4_ = fStack_23b8;
          auVar11._12_4_ = fStack_23b4;
          auVar11._16_4_ = fStack_23b0;
          auVar11._20_4_ = fStack_23ac;
          auVar11._24_4_ = fStack_23a8;
          auVar11._28_4_ = fStack_23a4;
          auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar11,*(undefined1 (*) [32])(uVar24 + 0x40))
          ;
          auVar37._0_4_ = auVar39._0_4_ * (float)(local_2480 ^ (uint)auVar31._0_4_);
          auVar37._4_4_ = auVar39._4_4_ * (float)(uStack_247c ^ (uint)auVar31._4_4_);
          auVar37._8_4_ = auVar39._8_4_ * (float)(uStack_2478 ^ (uint)auVar31._8_4_);
          auVar37._12_4_ = auVar39._12_4_ * (float)(uStack_2474 ^ (uint)auVar31._12_4_);
          auVar37._16_4_ = fStack_2470 * 0.0;
          auVar37._20_4_ = fStack_246c * 0.0;
          auVar37._24_4_ = fStack_2468 * 0.0;
          auVar37._28_4_ = 0;
          auVar39 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar11,*(undefined1 (*) [32])(uVar24 + 0x60));
          auVar35._0_4_ = auVar39._0_4_ * (float)((uint)auVar34._0_4_ ^ local_2480);
          auVar35._4_4_ = auVar39._4_4_ * (float)((uint)auVar34._4_4_ ^ uStack_247c);
          auVar35._8_4_ = auVar39._8_4_ * (float)((uint)auVar34._8_4_ ^ uStack_2478);
          auVar35._12_4_ = auVar39._12_4_ * (float)((uint)auVar34._12_4_ ^ uStack_2474);
          auVar35._16_4_ = fStack_2470 * 0.0;
          auVar35._20_4_ = fStack_246c * 0.0;
          auVar35._24_4_ = fStack_2468 * 0.0;
          auVar35._28_4_ = 0;
          auVar46 = ZEXT3264(local_2500);
          auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar11,*(undefined1 (*) [32])(uVar24 + 0x80))
          ;
          auVar33._0_4_ = auVar32._0_4_ * (float)((uint)auVar36._0_4_ ^ local_2480);
          auVar33._4_4_ = auVar32._4_4_ * (float)((uint)auVar36._4_4_ ^ uStack_247c);
          auVar33._8_4_ = auVar32._8_4_ * (float)((uint)auVar36._8_4_ ^ uStack_2478);
          auVar33._12_4_ = auVar32._12_4_ * (float)((uint)auVar36._12_4_ ^ uStack_2474);
          auVar33._16_4_ = fStack_2470 * 0.0;
          auVar33._20_4_ = fStack_246c * 0.0;
          auVar33._24_4_ = fStack_2468 * 0.0;
          auVar33._28_4_ = 0;
          auVar38._0_4_ = auVar31._0_4_ + auVar37._0_4_;
          auVar38._4_4_ = auVar31._4_4_ + auVar37._4_4_;
          auVar38._8_4_ = auVar31._8_4_ + auVar37._8_4_;
          auVar38._12_4_ = auVar31._12_4_ + auVar37._12_4_;
          auVar38._16_4_ = auVar37._16_4_ + 0.0;
          auVar38._20_4_ = auVar37._20_4_ + 0.0;
          auVar38._24_4_ = auVar37._24_4_ + 0.0;
          auVar38._28_4_ = 0;
          auVar40._0_4_ = auVar34._0_4_ + auVar35._0_4_;
          auVar40._4_4_ = auVar34._4_4_ + auVar35._4_4_;
          auVar40._8_4_ = auVar34._8_4_ + auVar35._8_4_;
          auVar40._12_4_ = auVar34._12_4_ + auVar35._12_4_;
          auVar40._16_4_ = auVar35._16_4_ + 0.0;
          auVar40._20_4_ = auVar35._20_4_ + 0.0;
          auVar40._24_4_ = auVar35._24_4_ + 0.0;
          auVar40._28_4_ = 0;
          auVar48 = ZEXT3264(local_2520);
          auVar41._0_4_ = auVar36._0_4_ + auVar33._0_4_;
          auVar41._4_4_ = auVar36._4_4_ + auVar33._4_4_;
          auVar41._8_4_ = auVar36._8_4_ + auVar33._8_4_;
          auVar41._12_4_ = auVar36._12_4_ + auVar33._12_4_;
          auVar41._16_4_ = auVar33._16_4_ + 0.0;
          auVar41._20_4_ = auVar33._20_4_ + 0.0;
          auVar41._24_4_ = auVar33._24_4_ + 0.0;
          auVar41._28_4_ = 0;
          auVar50 = ZEXT3264(local_2540);
          auVar10 = vpminsd_avx2(auVar35,auVar40);
          auVar11 = vpminsd_avx2(auVar33,auVar41);
          auVar10 = vmaxps_avx(auVar10,auVar11);
          auVar7 = vpminsd_avx2(auVar37,auVar38);
          auVar6 = vpmaxsd_avx2(auVar37,auVar38);
          auVar11 = vpmaxsd_avx2(auVar35,auVar40);
          auVar33 = vpmaxsd_avx2(auVar33,auVar41);
          auVar42 = ZEXT3264(local_24a0);
          auVar33 = vminps_avx(auVar11,auVar33);
          auVar11 = vmaxps_avx(local_2560,auVar7);
          auVar44 = ZEXT3264(local_24e0);
          local_2580 = vmaxps_avx(auVar11,auVar10);
          auVar43 = ZEXT3264(local_24c0);
          auVar10 = vminps_avx(auVar30._0_32_,auVar6);
          auVar10 = vminps_avx(auVar10,auVar33);
          auVar10 = vcmpps_avx(local_2580,auVar10,2);
          uVar16 = vmovmskps_avx(auVar10);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar16);
          goto LAB_00672014;
        }
        bVar15 = false;
      }
      if (bVar15) {
        if (unaff_R13 == 0) {
          iVar17 = 4;
        }
        else {
          uVar24 = uVar25 & 0xfffffffffffffff0;
          lVar18 = 0;
          for (uVar25 = unaff_R13; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          iVar17 = 0;
          uVar21 = unaff_R13 - 1 & unaff_R13;
          uVar25 = *(ulong *)(uVar24 + lVar18 * 8);
          if (uVar21 != 0) {
            uVar4 = *(uint *)(local_2580 + lVar18 * 4);
            lVar18 = 0;
            for (uVar12 = uVar21; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
            uVar21 = uVar21 - 1 & uVar21;
            uVar12 = *(ulong *)(uVar24 + lVar18 * 8);
            uVar5 = *(uint *)(local_2580 + lVar18 * 4);
            if (uVar21 == 0) {
              if (uVar4 < uVar5) {
                *(ulong *)*pauVar27 = uVar12;
                *(uint *)(*pauVar27 + 8) = uVar5;
                pauVar27 = pauVar27 + 1;
              }
              else {
                *(ulong *)*pauVar27 = uVar25;
                *(uint *)(*pauVar27 + 8) = uVar4;
                uVar25 = uVar12;
                pauVar27 = pauVar27 + 1;
              }
            }
            else {
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar25;
              auVar31 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar4));
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar12;
              auVar34 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar5));
              lVar18 = 0;
              for (uVar25 = uVar21; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                lVar18 = lVar18 + 1;
              }
              uVar21 = uVar21 - 1 & uVar21;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)(uVar24 + lVar18 * 8);
              auVar32 = vpunpcklqdq_avx(auVar36,ZEXT416(*(uint *)(local_2580 + lVar18 * 4)));
              auVar36 = vpcmpgtd_avx(auVar34,auVar31);
              if (uVar21 == 0) {
                auVar39 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar34,auVar31,auVar39);
                auVar31 = vblendvps_avx(auVar31,auVar34,auVar39);
                auVar34 = vpcmpgtd_avx(auVar32,auVar36);
                auVar39 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar32,auVar36,auVar39);
                auVar36 = vblendvps_avx(auVar36,auVar32,auVar39);
                auVar32 = vpcmpgtd_avx(auVar36,auVar31);
                auVar39 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar36,auVar31,auVar39);
                auVar31 = vblendvps_avx(auVar31,auVar36,auVar39);
                *pauVar27 = auVar31;
                pauVar27[1] = auVar32;
                uVar25 = auVar34._0_8_;
                pauVar27 = pauVar27 + 2;
              }
              else {
                lVar18 = 0;
                for (uVar25 = uVar21; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
                {
                  lVar18 = lVar18 + 1;
                }
                uVar21 = uVar21 - 1 & uVar21;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = *(ulong *)(uVar24 + lVar18 * 8);
                auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_2580 + lVar18 * 4)));
                if (uVar21 == 0) {
                  auVar8 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar34,auVar31,auVar8);
                  auVar31 = vblendvps_avx(auVar31,auVar34,auVar8);
                  auVar34 = vpcmpgtd_avx(auVar39,auVar32);
                  auVar8 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar39,auVar32,auVar8);
                  auVar32 = vblendvps_avx(auVar32,auVar39,auVar8);
                  auVar39 = vpcmpgtd_avx(auVar32,auVar31);
                  auVar8 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar32,auVar31,auVar8);
                  auVar31 = vblendvps_avx(auVar31,auVar32,auVar8);
                  auVar32 = vpcmpgtd_avx(auVar34,auVar36);
                  auVar8 = vpshufd_avx(auVar32,0xaa);
                  auVar32 = vblendvps_avx(auVar34,auVar36,auVar8);
                  auVar34 = vblendvps_avx(auVar36,auVar34,auVar8);
                  auVar36 = vpcmpgtd_avx(auVar39,auVar34);
                  auVar8 = vpshufd_avx(auVar36,0xaa);
                  auVar36 = vblendvps_avx(auVar39,auVar34,auVar8);
                  auVar34 = vblendvps_avx(auVar34,auVar39,auVar8);
                  *pauVar27 = auVar31;
                  pauVar27[1] = auVar34;
                  pauVar27[2] = auVar36;
                  uVar25 = auVar32._0_8_;
                  pauVar28 = pauVar27 + 3;
                }
                else {
                  *pauVar27 = auVar31;
                  pauVar27[1] = auVar34;
                  pauVar27[2] = auVar32;
                  pauVar27[3] = auVar39;
                  lVar18 = 0x30;
                  do {
                    lVar22 = lVar18;
                    lVar18 = 0;
                    for (uVar25 = uVar21; (uVar25 & 1) == 0;
                        uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                      lVar18 = lVar18 + 1;
                    }
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = *(ulong *)(uVar24 + lVar18 * 8);
                    auVar31 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_2580 + lVar18 * 4)));
                    *(undefined1 (*) [16])(pauVar27[1] + lVar22) = auVar31;
                    uVar21 = uVar21 - 1 & uVar21;
                    lVar18 = lVar22 + 0x10;
                  } while (uVar21 != 0);
                  pauVar28 = (undefined1 (*) [16])(pauVar27[1] + lVar22);
                  if (lVar22 + 0x10 != 0) {
                    lVar18 = 0x10;
                    pauVar20 = pauVar27;
                    do {
                      uVar13 = *(undefined8 *)pauVar20[1];
                      uVar14 = *(undefined8 *)(pauVar20[1] + 8);
                      uVar4 = *(uint *)(pauVar20[1] + 8);
                      pauVar20 = pauVar20 + 1;
                      lVar22 = lVar18;
                      do {
                        if (uVar4 <= *(uint *)(pauVar27[-1] + lVar22 + 8)) {
                          pauVar23 = (undefined1 (*) [16])(*pauVar27 + lVar22);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar27 + lVar22) =
                             *(undefined1 (*) [16])(pauVar27[-1] + lVar22);
                        lVar22 = lVar22 + -0x10;
                        pauVar23 = pauVar27;
                      } while (lVar22 != 0);
                      *(undefined8 *)*pauVar23 = uVar13;
                      *(undefined8 *)(*pauVar23 + 8) = uVar14;
                      lVar18 = lVar18 + 0x10;
                    } while (pauVar28 != pauVar20);
                  }
                  uVar25 = *(ulong *)*pauVar28;
                }
                auVar42 = ZEXT3264(auVar42._0_32_);
                auVar43 = ZEXT3264(auVar43._0_32_);
                auVar44 = ZEXT3264(auVar44._0_32_);
                auVar45 = ZEXT3264(local_2560);
                pauVar27 = pauVar28;
              }
            }
          }
        }
      }
      else {
        iVar17 = 6;
      }
    } while (iVar17 == 0);
    if (iVar17 == 6) {
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(uVar25 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context);
      auVar50 = ZEXT3264(local_2540);
      auVar48 = ZEXT3264(local_2520);
      auVar46 = ZEXT3264(local_2500);
      auVar45 = ZEXT3264(local_2560);
      auVar44 = ZEXT3264(local_24e0);
      auVar43 = ZEXT3264(local_24c0);
      auVar42 = ZEXT3264(local_24a0);
      uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar30 = ZEXT3264(CONCAT428(uVar16,CONCAT424(uVar16,CONCAT420(uVar16,CONCAT416(uVar16,
                                                  CONCAT412(uVar16,CONCAT48(uVar16,CONCAT44(uVar16,
                                                  uVar16))))))));
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }